

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Kf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew_00;
  char *pcVar2;
  int c;
  Gia_Man_t *pNew;
  Jf_Par_t *pPars;
  Jf_Par_t Pars;
  char Buffer [200];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Kf_ManSetDefaultPars((Jf_Par_t *)&pPars);
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"KCPDWaekmdcgtsvwh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Empty GIA network.\n");
        return 1;
      }
      pNew_00 = Kf_ManPerformMapping(pAbc->pGia,(Jf_Par_t *)&pPars);
      if (pNew_00 == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Kf(): Mapping into LUTs has failed.\n");
        return 1;
      }
      Abc_FrameUpdateGia(pAbc,pNew_00);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by a positive integer.\n");
        goto LAB_002b21fe;
      }
      pPars._4_4_ = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (((int)pPars._4_4_ < 1) || (Pars.fVeryVerbose < (int)pPars._4_4_)) {
        Abc_Print(-1,"This number of cuts (%d) is not supported.\n",(ulong)pPars._4_4_);
        goto LAB_002b21fe;
      }
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by a floating point number.\n");
        goto LAB_002b21fe;
      }
      Pars.nDelayLut2 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((double)Pars.nDelayLut2 <= 0.0) goto LAB_002b21fe;
      break;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by a positive integer.\n");
        goto LAB_002b21fe;
      }
      pPars._0_4_ = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (((int)(uint)pPars < 2) || (Pars.fVerbose < (int)(uint)pPars)) {
        Abc_Print(-1,"LUT size %d is not supported.\n",(ulong)(uint)pPars);
        goto LAB_002b21fe;
      }
      break;
    case 0x50:
      if (globalUtilOptind < argc) {
        Pars.nLutSize = atoi(argv[globalUtilOptind]);
        iVar1 = Pars.nLutSize;
        goto joined_r0x002b2078;
      }
      Abc_Print(-1,"Command line switch \"-P\" should be followed by a positive integer.\n");
      goto LAB_002b21fe;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by a positive integer.\n");
        goto LAB_002b21fe;
      }
      Pars.nAreaTuner = atoi(argv[globalUtilOptind]);
      iVar1 = Pars.nAreaTuner;
joined_r0x002b2078:
      globalUtilOptind = globalUtilOptind + 1;
      if (iVar1 < 0) {
LAB_002b21fe:
        if (Pars.nDelayLut2 == -1) {
          sprintf((char *)&Pars.pTimesReq,"best possible");
        }
        else {
          sprintf((char *)&Pars.pTimesReq,"%d",(ulong)(uint)Pars.nDelayLut2);
        }
        Abc_Print(-2,"usage: &kf [-KCPDW num] [-akmdcgtsvwh]\n");
        Abc_Print(-2,"\t           performs technology mapping of the network\n");
        Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",
                  (ulong)(uint)Pars.fVerbose,(ulong)(uint)pPars);
        Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",
                  (ulong)(uint)Pars.fVeryVerbose,(ulong)pPars._4_4_);
        Abc_Print(-2,
                  "\t-P num   : the number of cut computation processes (0 <= P <= %d) [default = %d]\n"
                  ,(ulong)(uint)Pars.nLutSizeMax,(ulong)(uint)Pars.nLutSize);
        Abc_Print(-2,"\t-D num   : sets the delay constraint for the mapping [default = %s]\n",
                  &Pars.pTimesReq);
        Abc_Print(-2,
                  "\t-W num   : min frequency when printing functions with \"-w\" [default = %d]\n",
                  (ulong)(uint)Pars.nAreaTuner);
        pcVar2 = "no";
        if (Pars.nFastEdges != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-a       : toggles area-oriented mapping [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (Pars.fPinQuick != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-e       : toggles edge vs node minimization [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (Pars.fUseMux7 != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (Pars.fPower != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-m       : toggles cut minimization [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (Pars.fCoarsen != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-d       : toggles using DSD to represent cut functions [default = %s]\n",
                  pcVar2);
        pcVar2 = "no";
        if (Pars.fCutMin != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-c       : toggles mapping for CNF generation [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (Pars.fAddOrCla != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-g       : toggles generating AIG without mapping [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (Pars.fPureAig != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-t       : toggles cut computation using hash table [default = %s]\n",pcVar2
                 );
        pcVar2 = "no";
        if (Pars.fDoAverage != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-s       : toggles cut computation using a simple method [default = %s]\n",
                  pcVar2);
        pcVar2 = "no";
        if (Pars.fCutSimple != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (Pars.fCutGroup != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-w       : toggles very verbose output [default = %s]\n",pcVar2);
        Abc_Print(-2,"\t-h       : prints the command usage\n");
        return 1;
      }
      break;
    case 0x61:
      Pars.nFastEdges = Pars.nFastEdges ^ 1;
      break;
    case 99:
      Pars.fCutMin = Pars.fCutMin ^ 1;
      break;
    case 100:
      Pars.fCoarsen = Pars.fCoarsen ^ 1;
      break;
    case 0x65:
      Pars.fPinQuick = Pars.fPinQuick ^ 1;
      break;
    case 0x67:
      Pars.fAddOrCla = Pars.fAddOrCla ^ 1;
      break;
    case 0x68:
    default:
      goto LAB_002b21fe;
    case 0x6b:
      Pars.fUseMux7 = Pars.fUseMux7 ^ 1;
      break;
    case 0x6d:
      Pars.fPower = Pars.fPower ^ 1;
      break;
    case 0x73:
      Pars.fDoAverage = Pars.fDoAverage ^ 1;
      break;
    case 0x74:
      Pars.fPureAig = Pars.fPureAig ^ 1;
      break;
    case 0x76:
      Pars.fCutSimple = Pars.fCutSimple ^ 1;
      break;
    case 0x77:
      Pars.fCutGroup = Pars.fCutGroup ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Kf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Kf_ManSetDefaultPars( Jf_Par_t * pPars );
    extern Gia_Man_t * Kf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars );
    char Buffer[200];
    Jf_Par_t Pars, * pPars = &Pars;
    Gia_Man_t * pNew; int c;
    Kf_ManSetDefaultPars( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCPDWaekmdcgtsvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 2 || pPars->nLutSize > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSize );
                goto usage;
            }
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutNum < 1 || pPars->nCutNum > pPars->nCutNumMax )
            {
                Abc_Print( -1, "This number of cuts (%d) is not supported.\n", pPars->nCutNum );
                goto usage;
            }
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nProcNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nProcNum < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nVerbLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVerbLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'e':
            pPars->fOptEdge ^= 1;
            break;
        case 'k':
            pPars->fCoarsen ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 'd':
            pPars->fFuncDsd ^= 1;
            break;
        case 'c':
            pPars->fGenCnf ^= 1;
            break;
        case 'g':
            pPars->fPureAig ^= 1;
            break;
        case 't':
            pPars->fCutHashing ^= 1;
            break;
        case 's':
            pPars->fCutSimple ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }

    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }

    pNew = Kf_ManPerformMapping( pAbc->pGia, pPars );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Kf(): Mapping into LUTs has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%d", pPars->DelayTarget );
    Abc_Print( -2, "usage: &kf [-KCPDW num] [-akmdcgtsvwh]\n" );
    Abc_Print( -2, "\t           performs technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n", pPars->nLutSizeMax, pPars->nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n", pPars->nCutNumMax, pPars->nCutNum );
    Abc_Print( -2, "\t-P num   : the number of cut computation processes (0 <= P <= %d) [default = %d]\n", pPars->nProcNumMax, pPars->nProcNum );
    Abc_Print( -2, "\t-D num   : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-W num   : min frequency when printing functions with \"-w\" [default = %d]\n", pPars->nVerbLimit );
    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-e       : toggles edge vs node minimization [default = %s]\n", pPars->fOptEdge? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n", pPars->fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles cut minimization [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles using DSD to represent cut functions [default = %s]\n", pPars->fFuncDsd? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggles mapping for CNF generation [default = %s]\n", pPars->fGenCnf? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles generating AIG without mapping [default = %s]\n", pPars->fPureAig? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggles cut computation using hash table [default = %s]\n", pPars->fCutHashing? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggles cut computation using a simple method [default = %s]\n", pPars->fCutSimple? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles very verbose output [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}